

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_handle_directive(Parser *this,csubstr directive_)

{
  csubstr fmt;
  csubstr fmt_00;
  ro_substr pattern;
  ro_substr pattern_00;
  bool bVar1;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  ulong in_RDX;
  long in_RDI;
  size_t prev;
  size_t pos;
  TagDirective *in_stack_000000f8;
  Tree *in_stack_00000100;
  TagDirective td;
  csubstr directive;
  basic_substring<const_char> *in_stack_00000268;
  Parser *in_stack_00000270;
  char *in_stack_00000278;
  size_t in_stack_00000280;
  undefined7 in_stack_fffffffffffffd98;
  char in_stack_fffffffffffffd9f;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  size_t in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  basic_substring<const_char> *in_stack_fffffffffffffdc0;
  Tree *this_00;
  undefined6 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  undefined8 in_stack_fffffffffffffdf0;
  char c;
  Tree *this_01;
  undefined6 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdfe;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffdff;
  basic_substring<char_const> local_1f0 [16];
  NodeType_e local_1e0;
  char *local_1d8;
  NodeData *local_1d0;
  ulong local_1c8;
  pfn_allocate local_1c0;
  pfn_free local_1b8;
  basic_substring<const_char> local_1b0;
  size_t local_1a0;
  char *local_198;
  basic_substring<char_const> local_190 [16];
  char *local_180;
  basic_substring<const_char> local_178;
  basic_substring<char_const> local_168 [16];
  NodeData *local_158;
  size_t local_150;
  size_t local_148;
  char *local_140;
  NodeData *local_138;
  ulong local_130;
  size_t local_128;
  basic_substring<char_const> local_120 [16];
  Tree local_110;
  char *local_10;
  NodeData *local_8;
  
  c = (char)((ulong)in_stack_fffffffffffffdf0 >> 0x38);
  local_110.m_cap = in_RDX;
  basic_substring<char_const>::basic_substring<5ul>(local_120,(char (*) [5])"%TAG");
  pattern.len._0_6_ = in_stack_fffffffffffffdc8;
  pattern.str = (char *)in_stack_fffffffffffffdc0;
  pattern.len._6_1_ = in_stack_fffffffffffffdce;
  pattern.len._7_1_ = in_stack_fffffffffffffdcf;
  bVar1 = basic_substring<const_char>::begins_with
                    ((basic_substring<const_char> *)
                     CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),pattern);
  if (bVar1) {
    TagDirective::TagDirective
              ((TagDirective *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    local_110.m_tag_directives[0].prefix.str = (char *)&local_110;
    local_110.m_tag_directives[0].handle.len = 4;
    if (local_110.m_cap < 4) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) &&
         (in_stack_fffffffffffffdff = is_debugger_attached(), (bool)in_stack_fffffffffffffdff)) {
        trap_instruction();
      }
      local_110.m_callbacks.m_error = (pfn_error)0x347f4b;
      local_110.m_tag_directives[0].handle.str._0_4_ = 0x1533;
      handle_error(0x347f4b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0);
    local_158 = (NodeData *)local_110.m_tag_directives[0].prefix.len;
    local_150 = local_110.m_tag_directives[0].next_node_id;
    local_110.m_buf = (NodeData *)local_110.m_tag_directives[0].prefix.len;
    local_110.m_cap = local_110.m_tag_directives[0].next_node_id;
    bVar1 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)&local_110,' ');
    if (!bVar1) {
      bVar1 = is_debugger_attached();
      if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<35ul>
                (local_168,(char (*) [35])"ERROR: malformed tag directive: {}");
      fmt.len = in_stack_00000280;
      fmt.str = in_stack_00000278;
      _err<c4::basic_substring<char_const>>(in_stack_00000270,fmt,in_stack_00000268);
    }
    local_178 = basic_substring<const_char>::triml
                          ((basic_substring<const_char> *)
                           CONCAT17(in_stack_fffffffffffffdff,
                                    CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)),c
                          );
    local_110.m_buf = (NodeData *)local_178.str;
    local_110.m_cap = local_178.len;
    local_180 = (char *)basic_substring<const_char>::find
                                  ((basic_substring<const_char> *)
                                   CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                   in_stack_fffffffffffffd9f,0x30f614);
    if (local_180 == (char *)0xffffffffffffffff) {
      bVar1 = is_debugger_attached();
      if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<35ul>
                (local_190,(char (*) [35])"ERROR: malformed tag directive: {}");
      fmt_00.len = in_stack_00000280;
      fmt_00.str = in_stack_00000278;
      _err<c4::basic_substring<char_const>>(in_stack_00000270,fmt_00,in_stack_00000268);
    }
    this_01 = &local_110;
    local_110.m_tag_directives[3].prefix.str = local_180;
    uVar5 = local_180 <= local_110.m_cap || local_180 == (char *)0xffffffffffffffff;
    local_110.m_tag_directives[3].prefix.len = (size_t)this_01;
    if (local_180 > local_110.m_cap && local_180 != (char *)0xffffffffffffffff) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) &&
         (in_stack_fffffffffffffdef = is_debugger_attached(), (bool)in_stack_fffffffffffffdef)) {
        trap_instruction();
      }
      local_110.m_tag_directives[3].handle.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_110.m_tag_directives[3].handle.len._0_4_ = 0x154e;
      handle_error(0x347f4b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
    }
    basic_substring<const_char>::basic_substring
              (in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0);
    local_1a0 = local_110.m_tag_directives[3].next_node_id;
    local_198 = local_10;
    local_148 = local_110.m_tag_directives[3].next_node_id;
    local_140 = local_10;
    local_110.m_callbacks.m_user_data = &local_110;
    local_110.m_arena_pos = (size_t)local_10;
    if (local_110.m_cap < local_10) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_110.m_arena.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_110.m_arena.len._0_4_ = 0x1533;
      handle_error(0x347f4b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0);
    local_1c0 = local_110.m_callbacks.m_allocate;
    local_1b8 = local_110.m_callbacks.m_free;
    local_1b0 = basic_substring<const_char>::triml
                          ((basic_substring<const_char> *)
                           CONCAT17(in_stack_fffffffffffffdff,
                                    CONCAT16(uVar5,in_stack_fffffffffffffdf8)),
                           (char)((ulong)this_01 >> 0x38));
    local_110.m_buf = (NodeData *)local_1b0.str;
    local_110.m_cap = local_1b0.len;
    local_180 = (char *)basic_substring<const_char>::find
                                  ((basic_substring<const_char> *)
                                   CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                   in_stack_fffffffffffffd9f,0x30f934);
    if (local_180 != (char *)0xffffffffffffffff) {
      this_00 = &local_110;
      local_110.m_tag_directives[2].handle.len = (size_t)local_180;
      local_110.m_tag_directives[2].prefix.str = (char *)this_00;
      if (local_110.m_cap < local_180 && local_180 != (char *)0xffffffffffffffff) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) &&
           (in_stack_fffffffffffffdbf = is_debugger_attached(), (bool)in_stack_fffffffffffffdbf)) {
          trap_instruction();
        }
        local_110.m_tag_directives[1].next_node_id = 0x347f4b;
        local_110.m_tag_directives[2].handle.str._0_4_ = 0x154e;
        handle_error(0x347f4b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)this_00,
                 (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                 (size_t)this_00->m_buf);
      local_1d0 = (NodeData *)local_110.m_tag_directives[2].prefix.len;
      local_1c8 = local_110.m_tag_directives[2].next_node_id;
      local_110.m_buf = (NodeData *)local_110.m_tag_directives[2].prefix.len;
      local_110.m_cap = local_110.m_tag_directives[2].next_node_id;
    }
    local_138 = local_110.m_buf;
    local_130 = local_110.m_cap;
    local_128 = Tree::size(*(Tree **)(in_RDI + 0x30));
    sVar4 = Tree::size(*(Tree **)(in_RDI + 0x30));
    if (sVar4 != 0) {
      sVar4 = Tree::size(*(Tree **)(in_RDI + 0x30));
      local_1d8 = (char *)(sVar4 - 1);
      bVar2 = Tree::is_root(this_01,CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      bVar1 = false;
      if (bVar2) {
        local_1e0 = (NodeType_e)
                    Tree::type((Tree *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98)
                               ,0x30fb55);
        local_110.m_tag_directives[1].handle.len = (size_t)&local_1e0;
        local_110.m_tag_directives[1].handle.str = (char *)0x0;
        bVar1 = false;
        if (local_1e0 != NOTYPE) {
          local_110.m_tag_directives[1].prefix.len = *(size_t *)(in_RDI + 0x30);
          local_110.m_tag_directives[1].prefix.str = local_1d8;
          local_8 = Tree::_p(this_01,CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          bVar1 = ((local_8->m_type).type & STREAM) != STREAM;
        }
      }
      if (bVar1) {
        local_128 = local_128 + 1;
      }
    }
    Tree::add_tag_directive(in_stack_00000100,in_stack_000000f8);
  }
  else {
    basic_substring<char_const>::basic_substring<6ul>(local_1f0,(char (*) [6])"%YAML");
    pattern_00.len._0_6_ = in_stack_fffffffffffffdc8;
    pattern_00.str = (char *)in_stack_fffffffffffffdc0;
    pattern_00.len._6_1_ = in_stack_fffffffffffffdce;
    pattern_00.len._7_1_ = in_stack_fffffffffffffdcf;
    basic_substring<const_char>::begins_with
              ((basic_substring<const_char> *)
               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),pattern_00);
  }
  return;
}

Assistant:

void Parser::_handle_directive(csubstr directive_)
{
    csubstr directive = directive_;
    if(directive.begins_with("%TAG"))
    {
        TagDirective td;
        _c4dbgpf("%TAG directive: {}", directive_);
        directive = directive.sub(4);
        if(!directive.begins_with(' '))
            _c4err("malformed tag directive: {}", directive_);
        directive = directive.triml(' ');
        size_t pos = directive.find(' ');
        if(pos == npos)
            _c4err("malformed tag directive: {}", directive_);
        td.handle = directive.first(pos);
        directive = directive.sub(td.handle.len).triml(' ');
        pos = directive.find(' ');
        if(pos != npos)
            directive = directive.first(pos);
        td.prefix = directive;
        td.next_node_id = m_tree->size();
        if(m_tree->size() > 0)
        {
            size_t prev = m_tree->size() - 1;
            if(m_tree->is_root(prev) && m_tree->type(prev) != NOTYPE && !m_tree->is_stream(prev))
                ++td.next_node_id;
        }
        _c4dbgpf("%TAG: handle={} prefix={} next_node={}", td.handle, td.prefix, td.next_node_id);
        m_tree->add_tag_directive(td);
    }
    else if(directive.begins_with("%YAML"))
    {
        _c4dbgpf("%YAML directive! ignoring...: {}", directive);
    }
}